

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::GroupNorm_x86_fma::forward_inplace(GroupNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  float *pfVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  _func_int *p_Var21;
  float *pfVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  uint *puVar27;
  long lVar28;
  undefined1 (*pauVar29) [32];
  __m128 x64;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar132;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar137 [32];
  undefined1 auVar139 [32];
  undefined1 auVar141 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  _func_int *local_80;
  undefined1 auVar136 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  
  auVar5 = _DAT_005654a0;
  auVar4 = _DAT_00565480;
  iVar13 = bottom_top_blob->dims;
  pp_Var2 = this->_vptr_GroupNorm_x86_fma;
  local_80 = pp_Var2[-3];
  p_Var21 = (_func_int *)((long)&this->_vptr_GroupNorm_x86_fma + (long)local_80);
  iVar1 = *(int *)(&this->field_0xd0 + (long)local_80);
  uVar18 = (long)*(int *)(&this->field_0xd4 + (long)local_80) / (long)iVar1;
  uVar17 = uVar18 & 0xffffffff;
  uVar7 = (uint)uVar18;
  auVar80 = in_ZMM5._0_16_;
  if (iVar13 == 2) {
    if (0 < iVar1) {
      uVar8 = bottom_top_blob->w;
      uVar24 = uVar8 * uVar7;
      uVar14 = uVar24 & 0xfffffff8;
      lVar25 = 0;
      auVar78._8_8_ = 0x8000000000000000;
      auVar78._0_8_ = 0x8000000000000000;
      auVar80 = vpcmpeqd_avx(auVar80,auVar80);
      do {
        lVar28 = lVar25 * (int)uVar7;
        pauVar10 = (undefined1 (*) [32])
                   (bottom_top_blob->w * lVar28 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar144 = 0.0;
        fVar146 = 0.0;
        fVar131 = 0.0;
        fVar142 = 0.0;
        fVar148 = 0.0;
        fVar150 = 0.0;
        fVar152 = 0.0;
        fVar154 = 0.0;
        pauVar11 = pauVar10;
        uVar16 = 0;
        fVar132 = 0.0;
        fVar143 = 0.0;
        fVar145 = 0.0;
        fVar147 = 0.0;
        fVar149 = 0.0;
        fVar151 = 0.0;
        fVar153 = 0.0;
        fVar155 = 0.0;
        if (7 < (int)uVar24) {
          iVar13 = 7;
          do {
            fVar131 = fVar131 + *(float *)*pauVar11;
            fVar142 = fVar142 + *(float *)(*pauVar11 + 4);
            fVar144 = fVar144 + *(float *)(*pauVar11 + 8);
            fVar146 = fVar146 + *(float *)(*pauVar11 + 0xc);
            fVar148 = fVar148 + *(float *)(*pauVar11 + 0x10);
            fVar150 = fVar150 + *(float *)(*pauVar11 + 0x14);
            fVar152 = fVar152 + *(float *)(*pauVar11 + 0x18);
            fVar154 = fVar154 + *(float *)(*pauVar11 + 0x1c);
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar16 = uVar14;
            fVar132 = fVar131;
            fVar143 = fVar142;
            fVar145 = fVar144;
            fVar147 = fVar146;
            fVar149 = fVar148;
            fVar151 = fVar150;
            fVar153 = fVar152;
            fVar155 = fVar154;
          } while (iVar13 < (int)uVar24);
        }
        uVar15 = uVar16 | 3;
        auVar68 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar144 = auVar68._4_4_;
          fVar146 = auVar68._8_4_;
          fVar131 = auVar68._12_4_;
          if ((int)uVar24 <= (int)uVar15) break;
          auVar68._0_4_ = auVar68._0_4_ + *(float *)*pauVar11;
          auVar68._4_4_ = fVar144 + *(float *)(*pauVar11 + 4);
          auVar68._8_4_ = fVar146 + *(float *)(*pauVar11 + 8);
          auVar68._12_4_ = fVar131 + *(float *)(*pauVar11 + 0xc);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        auVar91._0_4_ = fVar132 + fVar149;
        auVar91._4_4_ = fVar143 + fVar151;
        auVar91._8_4_ = fVar145 + fVar153;
        auVar91._12_4_ = fVar147 + fVar155;
        auVar70 = vshufpd_avx(auVar91,auVar91,1);
        auVar92._0_4_ = auVar70._0_4_ + auVar91._0_4_;
        auVar92._4_4_ = auVar70._4_4_ + auVar91._4_4_;
        auVar92._8_4_ = auVar70._8_4_ + auVar91._8_4_;
        auVar92._12_4_ = auVar70._12_4_ + auVar91._12_4_;
        auVar70 = vshufpd_avx(auVar68,auVar68,1);
        auVar69._0_4_ = auVar70._0_4_ + auVar68._0_4_;
        auVar69._4_4_ = auVar70._4_4_ + fVar144;
        auVar69._8_4_ = auVar70._8_4_ + fVar146;
        auVar69._12_4_ = auVar70._12_4_ + fVar131;
        auVar68 = vhaddps_avx(auVar92,auVar92);
        auVar70 = vmovshdup_avx(auVar69);
        fVar144 = auVar68._0_4_ + auVar70._0_4_ + auVar69._0_4_;
        if ((int)uVar16 < (int)uVar24) {
          uVar18 = CONCAT44(0,~uVar16 + uVar24);
          auVar68 = vblendps_avx(ZEXT416((uint)fVar144),_DAT_00564cb0,0xe);
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar18;
          auVar91 = vpshufd_avx(auVar70,0x44);
          auVar70 = vorps_avx(auVar91,auVar78);
          auVar69 = vorps_avx(auVar91,auVar78);
          uVar17 = 0;
          auVar164 = ZEXT1664(auVar68);
          do {
            auVar141 = auVar164;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = uVar17;
            auVar68 = vpshufd_avx(auVar93,0x44);
            auVar105._16_16_ = auVar68;
            auVar105._0_16_ = auVar68;
            auVar166 = vorps_avx(auVar105,auVar4);
            auVar105 = vorps_avx(auVar105,auVar5);
            auVar68 = vorps_avx(auVar91,auVar78);
            auVar116._8_4_ = auVar105._24_4_;
            auVar116._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
            auVar116._12_4_ = auVar105._28_4_ ^ 0x80000000;
            auVar93 = vpcmpgtq_avx(auVar116,auVar68);
            auVar94._8_4_ = auVar105._8_4_;
            auVar169._8_4_ = auVar94._8_4_;
            auVar169._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
            auVar169._12_4_ = auVar105._12_4_ ^ 0x80000000;
            auVar92 = vpcmpgtq_avx(auVar169,auVar70);
            auVar92 = vpackssdw_avx(auVar92,auVar93);
            auVar179._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
            auVar179._8_4_ = auVar166._24_4_;
            auVar179._12_4_ = auVar166._28_4_ ^ 0x80000000;
            auVar116 = vpcmpgtq_avx(auVar179,auVar68);
            auVar180._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
            auVar180._8_4_ = auVar166._8_4_;
            auVar180._12_4_ = auVar166._12_4_ ^ 0x80000000;
            auVar68 = vpcmpgtq_avx(auVar180,auVar69);
            auVar68 = vpackssdw_avx(auVar68,auVar116);
            auVar68 = vpackssdw_avx(auVar68 ^ auVar80,auVar92 ^ auVar80);
            auVar92 = vpmovsxwd_avx(auVar68);
            auVar68 = vpunpckhwd_avx(auVar68,auVar68);
            auVar175._16_16_ = auVar68;
            auVar175._0_16_ = auVar92;
            auVar175 = vmaskmovps_avx(auVar175,*(undefined1 (*) [32])(*pauVar11 + uVar17 * 4));
            auVar134._0_4_ = auVar175._0_4_ + auVar141._0_4_;
            auVar134._4_4_ = auVar175._4_4_ + auVar141._4_4_;
            auVar134._8_4_ = auVar175._8_4_ + auVar141._8_4_;
            auVar134._12_4_ = auVar175._12_4_ + auVar141._12_4_;
            auVar138._16_4_ = auVar175._16_4_ + auVar141._16_4_;
            auVar138._0_16_ = auVar134;
            auVar138._20_4_ = auVar175._20_4_ + auVar141._20_4_;
            auVar138._24_4_ = auVar175._24_4_ + auVar141._24_4_;
            auVar138._28_4_ = auVar175._28_4_ + auVar141._28_4_;
            uVar17 = uVar17 + 8;
            auVar164 = ZEXT3264(auVar138);
          } while ((uVar18 + 8 & 0x1fffffff8) != uVar17);
          auVar68 = vorps_avx(auVar91,auVar78);
          auVar94._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
          auVar94._12_4_ = auVar105._12_4_ ^ 0x80000000;
          auVar68 = vpcmpgtq_avx(auVar94,auVar68);
          auVar70 = vpackssdw_avx(auVar68,auVar93);
          auVar68 = vorps_avx(auVar91,auVar78);
          auVar117._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
          auVar117._8_4_ = auVar166._8_4_;
          auVar117._12_4_ = auVar166._12_4_ ^ 0x80000000;
          auVar68 = vpcmpgtq_avx(auVar117,auVar68);
          auVar68 = vpackssdw_avx(auVar68,auVar116);
          auVar68 = vblendvps_avx(auVar141._0_16_,auVar134,auVar68 ^ auVar80);
          auVar70 = vblendvps_avx(auVar141._16_16_,auVar138._16_16_,auVar70 ^ auVar80);
          auVar68 = vhaddps_avx(auVar70,auVar68);
          auVar68 = vhaddps_avx(auVar68,auVar68);
          auVar68 = vhaddps_avx(auVar68,auVar68);
          fVar144 = auVar68._0_4_;
        }
        fVar144 = (1.0 / (float)(int)uVar24) * fVar144;
        auVar68 = vshufps_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),0);
        pauVar11 = pauVar10;
        if ((int)uVar24 < 8) {
          auVar166 = SUB6432(ZEXT864(0),0);
          uVar16 = 0;
        }
        else {
          auVar106._16_16_ = auVar68;
          auVar106._0_16_ = auVar68;
          auVar164 = ZEXT864(0);
          iVar13 = 7;
          do {
            auVar166 = vsubps_avx(*pauVar11,auVar106);
            auVar70 = vfmadd231ps_fma(auVar164._0_32_,auVar166,auVar166);
            auVar164 = ZEXT1664(auVar70);
            auVar166 = ZEXT1632(auVar70);
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar16 = uVar14;
          } while (iVar13 < (int)uVar24);
        }
        auVar70 = ZEXT816(0) << 0x40;
        uVar15 = uVar16 | 3;
        while ((int)uVar15 < (int)uVar24) {
          auVar69 = vsubps_avx(*(undefined1 (*) [16])*pauVar11,auVar68);
          auVar70 = vfmadd231ps_fma(auVar70,auVar69,auVar69);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar15 = uVar16 + 7;
          uVar16 = uVar16 + 4;
        }
        auVar95._0_4_ = auVar166._0_4_ + auVar166._16_4_;
        auVar95._4_4_ = auVar166._4_4_ + auVar166._20_4_;
        auVar95._8_4_ = auVar166._8_4_ + auVar166._24_4_;
        auVar95._12_4_ = auVar166._12_4_ + auVar166._28_4_;
        auVar69 = vshufpd_avx(auVar95,auVar95,1);
        auVar96._0_4_ = auVar69._0_4_ + auVar95._0_4_;
        auVar96._4_4_ = auVar69._4_4_ + auVar95._4_4_;
        auVar96._8_4_ = auVar69._8_4_ + auVar95._8_4_;
        auVar96._12_4_ = auVar69._12_4_ + auVar95._12_4_;
        auVar69 = vshufpd_avx(auVar70,auVar70,1);
        auVar118._0_4_ = auVar70._0_4_ + auVar69._0_4_;
        auVar118._4_4_ = auVar70._4_4_ + auVar69._4_4_;
        auVar118._8_4_ = auVar70._8_4_ + auVar69._8_4_;
        auVar118._12_4_ = auVar70._12_4_ + auVar69._12_4_;
        auVar70 = vhaddps_avx(auVar96,auVar96);
        auVar69 = vmovshdup_avx(auVar118);
        fVar146 = auVar69._0_4_ + auVar70._0_4_ + auVar118._0_4_;
        auVar70 = ZEXT416((uint)fVar146);
        if ((int)uVar16 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar16 + uVar24);
          auVar70 = vblendps_avx(ZEXT416((uint)fVar146),_DAT_00564cb0,0xe);
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar17;
          auVar91 = vpshufd_avx(auVar97,0x44);
          auVar166._16_16_ = auVar68;
          auVar166._0_16_ = auVar68;
          auVar68 = vorps_avx(auVar91,auVar78);
          auVar69 = vorps_avx(auVar91,auVar78);
          uVar18 = 0;
          do {
            auVar94 = auVar70;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = uVar18;
            auVar70 = vpshufd_avx(auVar98,0x44);
            auVar107._16_16_ = auVar70;
            auVar107._0_16_ = auVar70;
            auVar105 = vorps_avx(auVar107,auVar4);
            auVar175 = vorps_avx(auVar107,auVar5);
            auVar70 = vorps_avx(auVar91,auVar78);
            auVar119._0_8_ = auVar175._16_8_ ^ 0x8000000000000000;
            auVar119._8_4_ = auVar175._24_4_;
            auVar119._12_4_ = auVar175._28_4_ ^ 0x80000000;
            auVar93 = vpcmpgtq_avx(auVar119,auVar70);
            auVar157._0_8_ = auVar175._0_8_ ^ 0x8000000000000000;
            auVar99._8_4_ = auVar175._8_4_;
            auVar157._8_4_ = auVar99._8_4_;
            auVar157._12_4_ = auVar175._12_4_ ^ 0x80000000;
            auVar92 = vpcmpgtq_avx(auVar157,auVar68);
            auVar92 = vpackssdw_avx(auVar92,auVar93);
            auVar35._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
            auVar35._8_4_ = auVar105._24_4_;
            auVar35._12_4_ = auVar105._28_4_ ^ 0x80000000;
            auVar116 = vpcmpgtq_avx(auVar35,auVar70);
            auVar36._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
            auVar36._8_4_ = auVar105._8_4_;
            auVar36._12_4_ = auVar105._12_4_ ^ 0x80000000;
            auVar70 = vpcmpgtq_avx(auVar36,auVar69);
            auVar70 = vpackssdw_avx(auVar70,auVar116);
            auVar70 = vpackssdw_avx(auVar70 ^ auVar80,auVar92 ^ auVar80);
            auVar92 = vpmovsxwd_avx(auVar70);
            auVar70 = vpunpckhwd_avx(auVar70,auVar70);
            auVar56._16_16_ = auVar70;
            auVar56._0_16_ = auVar92;
            auVar138 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])(*pauVar11 + uVar18 * 4));
            auVar138 = vsubps_avx(auVar138,auVar166);
            auVar70 = vfmadd213ps_fma(auVar138,auVar138,ZEXT1632(auVar94));
            uVar18 = uVar18 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar18);
          auVar68 = vorps_avx(auVar91,auVar78);
          auVar99._0_8_ = auVar175._0_8_ ^ 0x8000000000000000;
          auVar99._12_4_ = auVar175._12_4_ ^ 0x80000000;
          auVar68 = vpcmpgtq_avx(auVar99,auVar68);
          auVar69 = vpackssdw_avx(auVar68,auVar93);
          auVar68 = vorps_avx(auVar91,auVar78);
          auVar120._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
          auVar120._8_4_ = auVar105._8_4_;
          auVar120._12_4_ = auVar105._12_4_ ^ 0x80000000;
          auVar68 = vpcmpgtq_avx(auVar120,auVar68);
          auVar68 = vpackssdw_avx(auVar68,auVar116);
          auVar68 = vblendvps_avx(auVar94,auVar70,auVar68 ^ auVar80);
          auVar70 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar69 ^ auVar80);
          auVar68 = vhaddps_avx(auVar70,auVar68);
          auVar68 = vhaddps_avx(auVar68,auVar68);
          auVar70 = vhaddps_avx(auVar68,auVar68);
        }
        auVar70 = vfmadd213ss_fma(auVar70,ZEXT416((uint)(1.0 / (float)(int)uVar24)),
                                  ZEXT416(*(uint *)(p_Var21 + 0xd8)));
        auVar68 = vrsqrtss_avx(auVar70,auVar70);
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar68._0_4_)),auVar68,
                                  ZEXT416(0xc0400000));
        fVar146 = auVar68._0_4_ * -0.5 * auVar70._0_4_;
        fVar144 = fVar146 * -fVar144;
        if (*(int *)(p_Var21 + 0xdc) == 0) {
          auVar68 = vshufps_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),0);
          auVar70 = vshufps_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),0);
          uVar16 = 0;
          if (7 < (int)uVar24) {
            auVar75._16_16_ = auVar68;
            auVar75._0_16_ = auVar68;
            auVar109._16_16_ = auVar70;
            auVar109._0_16_ = auVar70;
            iVar13 = 7;
            do {
              auVar69 = vfmadd132ps_fma(*pauVar10,auVar109,auVar75);
              *pauVar10 = ZEXT1632(auVar69);
              pauVar10 = pauVar10 + 1;
              iVar13 = iVar13 + 8;
              uVar16 = uVar14;
            } while (iVar13 < (int)uVar24);
          }
          uVar15 = uVar16 | 3;
          while ((int)uVar15 < (int)uVar24) {
            auVar69 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar10,auVar70,auVar68);
            *(undefined1 (*) [16])*pauVar10 = auVar69;
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
            uVar15 = uVar16 + 7;
            uVar16 = uVar16 + 4;
          }
          if ((int)uVar16 < (int)uVar24) {
            uVar17 = CONCAT44(0,~uVar16 + uVar24);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar17;
            auVar69 = vpshufd_avx(auVar37,0x44);
            auVar159._16_16_ = auVar68;
            auVar159._0_16_ = auVar68;
            auVar139._16_16_ = auVar70;
            auVar139._0_16_ = auVar70;
            auVar68 = vorps_avx(auVar69,auVar78);
            auVar70 = vorps_avx(auVar69,auVar78);
            uVar18 = 0;
            do {
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar18;
              auVar91 = vpshufd_avx(auVar38,0x44);
              auVar57._16_16_ = auVar91;
              auVar57._0_16_ = auVar91;
              auVar166 = vorps_avx(auVar57,auVar4);
              auVar105 = vorps_avx(auVar57,auVar5);
              auVar91 = vorps_avx(auVar69,auVar78);
              auVar127._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
              auVar127._8_4_ = auVar105._24_4_;
              auVar127._12_4_ = auVar105._28_4_ ^ 0x80000000;
              auVar92 = vpcmpgtq_avx(auVar127,auVar91);
              auVar39._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
              auVar39._8_4_ = auVar105._8_4_;
              auVar39._12_4_ = auVar105._12_4_ ^ 0x80000000;
              auVar93 = vpcmpgtq_avx(auVar39,auVar68);
              auVar92 = vpackssdw_avx(auVar93,auVar92);
              auVar128._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
              auVar128._8_4_ = auVar166._24_4_;
              auVar128._12_4_ = auVar166._28_4_ ^ 0x80000000;
              auVar91 = vpcmpgtq_avx(auVar128,auVar91);
              auVar100._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
              auVar100._8_4_ = auVar166._8_4_;
              auVar100._12_4_ = auVar166._12_4_ ^ 0x80000000;
              auVar93 = vpcmpgtq_avx(auVar100,auVar70);
              auVar91 = vpackssdw_avx(auVar93,auVar91);
              auVar91 = vpackssdw_avx(auVar91 ^ auVar80,auVar92 ^ auVar80);
              auVar92 = vpmovsxwd_avx(auVar91);
              auVar91 = vpunpckhwd_avx(auVar91,auVar91);
              auVar58._16_16_ = auVar91;
              auVar58._0_16_ = auVar92;
              auVar166 = vmaskmovps_avx(auVar58,*(undefined1 (*) [32])(*pauVar10 + uVar18 * 4));
              auVar91 = vfmadd213ps_fma(auVar166,auVar159,auVar139);
              auVar166 = vmaskmovps_avx(auVar58,ZEXT1632(auVar91));
              *(undefined1 (*) [32])(*pauVar10 + uVar18 * 4) = auVar166;
              uVar18 = uVar18 + 8;
            } while ((uVar17 + 8 & 0x1fffffff8) != uVar18);
          }
        }
        else if (0 < (int)uVar7) {
          pfVar9 = (float *)(*(long *)(p_Var21 + 0xf0) * lVar28 + *(long *)(p_Var21 + 0xe0));
          puVar27 = (uint *)(lVar28 * *(long *)(p_Var21 + 0x138) + *(long *)(p_Var21 + 0x128));
          uVar16 = 0;
          do {
            fVar132 = *pfVar9 * fVar146;
            auVar69 = vfmadd213ss_fma(ZEXT416((uint)*pfVar9),ZEXT416((uint)fVar144),
                                      ZEXT416(*puVar27));
            auVar68 = vshufps_avx(ZEXT416((uint)fVar132),ZEXT416((uint)fVar132),0);
            auVar70 = vshufps_avx(auVar69,auVar69,0);
            if ((int)uVar8 < 8) {
              uVar15 = 0;
            }
            else {
              auVar74._16_16_ = auVar68;
              auVar74._0_16_ = auVar68;
              auVar108._16_16_ = auVar70;
              auVar108._0_16_ = auVar70;
              iVar13 = 7;
              do {
                auVar91 = vfmadd132ps_fma(*pauVar10,auVar108,auVar74);
                *pauVar10 = ZEXT1632(auVar91);
                pauVar10 = pauVar10 + 1;
                iVar13 = iVar13 + 8;
                uVar15 = uVar8 & 0xfffffff8;
              } while (iVar13 < (int)uVar8);
            }
            uVar23 = uVar15 | 3;
            while ((int)uVar23 < (int)uVar8) {
              auVar91 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar10,auVar70,auVar68);
              *(undefined1 (*) [16])*pauVar10 = auVar91;
              pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
              uVar23 = uVar15 + 7;
              uVar15 = uVar15 + 4;
            }
            iVar13 = uVar8 - uVar15;
            if (iVar13 != 0 && (int)uVar15 <= (int)uVar8) {
              do {
                auVar68 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar10),auVar69,ZEXT416((uint)fVar132)
                                         );
                *(int *)*pauVar10 = auVar68._0_4_;
                pauVar10 = (undefined1 (*) [32])(*pauVar10 + 4);
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            pfVar9 = pfVar9 + 1;
            puVar27 = puVar27 + 1;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar7);
        }
        lVar25 = lVar25 + 1;
        p_Var21 = (_func_int *)((long)&this->_vptr_GroupNorm_x86_fma + (long)pp_Var2[-3]);
      } while (lVar25 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
  }
  else if (iVar13 == 1) {
    if (0 < iVar1) {
      uVar8 = uVar7 & 0xfffffff8;
      lVar25 = 0;
      auVar77._8_8_ = 0x8000000000000000;
      auVar77._0_8_ = 0x8000000000000000;
      auVar80 = vpcmpeqd_avx(auVar80,auVar80);
      do {
        lVar28 = lVar25 * (int)uVar7;
        pauVar10 = (undefined1 (*) [32])
                   (bottom_top_blob->elemsize * lVar28 + (long)bottom_top_blob->data);
        fVar144 = 0.0;
        fVar146 = 0.0;
        fVar131 = 0.0;
        fVar142 = 0.0;
        fVar148 = 0.0;
        fVar150 = 0.0;
        fVar152 = 0.0;
        fVar154 = 0.0;
        pauVar11 = pauVar10;
        uVar24 = 0;
        fVar132 = 0.0;
        fVar143 = 0.0;
        fVar145 = 0.0;
        fVar147 = 0.0;
        fVar149 = 0.0;
        fVar151 = 0.0;
        fVar153 = 0.0;
        fVar155 = 0.0;
        if (7 < (int)uVar7) {
          iVar13 = 7;
          do {
            fVar131 = fVar131 + *(float *)*pauVar11;
            fVar142 = fVar142 + *(float *)(*pauVar11 + 4);
            fVar144 = fVar144 + *(float *)(*pauVar11 + 8);
            fVar146 = fVar146 + *(float *)(*pauVar11 + 0xc);
            fVar148 = fVar148 + *(float *)(*pauVar11 + 0x10);
            fVar150 = fVar150 + *(float *)(*pauVar11 + 0x14);
            fVar152 = fVar152 + *(float *)(*pauVar11 + 0x18);
            fVar154 = fVar154 + *(float *)(*pauVar11 + 0x1c);
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar24 = uVar8;
            fVar132 = fVar131;
            fVar143 = fVar142;
            fVar145 = fVar144;
            fVar147 = fVar146;
            fVar149 = fVar148;
            fVar151 = fVar150;
            fVar153 = fVar152;
            fVar155 = fVar154;
          } while (iVar13 < (int)uVar7);
        }
        uVar14 = uVar24 | 3;
        auVar64 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar144 = auVar64._4_4_;
          fVar146 = auVar64._8_4_;
          fVar131 = auVar64._12_4_;
          if ((int)uVar7 <= (int)uVar14) break;
          auVar64._0_4_ = auVar64._0_4_ + *(float *)*pauVar11;
          auVar64._4_4_ = fVar144 + *(float *)(*pauVar11 + 4);
          auVar64._8_4_ = fVar146 + *(float *)(*pauVar11 + 8);
          auVar64._12_4_ = fVar131 + *(float *)(*pauVar11 + 0xc);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar14 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar81._0_4_ = fVar132 + fVar149;
        auVar81._4_4_ = fVar143 + fVar151;
        auVar81._8_4_ = fVar145 + fVar153;
        auVar81._12_4_ = fVar147 + fVar155;
        auVar78 = vshufpd_avx(auVar81,auVar81,1);
        auVar82._0_4_ = auVar78._0_4_ + auVar81._0_4_;
        auVar82._4_4_ = auVar78._4_4_ + auVar81._4_4_;
        auVar82._8_4_ = auVar78._8_4_ + auVar81._8_4_;
        auVar82._12_4_ = auVar78._12_4_ + auVar81._12_4_;
        auVar78 = vshufpd_avx(auVar64,auVar64,1);
        auVar65._0_4_ = auVar78._0_4_ + auVar64._0_4_;
        auVar65._4_4_ = auVar78._4_4_ + fVar144;
        auVar65._8_4_ = auVar78._8_4_ + fVar146;
        auVar65._12_4_ = auVar78._12_4_ + fVar131;
        auVar78 = vhaddps_avx(auVar82,auVar82);
        auVar68 = vmovshdup_avx(auVar65);
        fVar144 = auVar78._0_4_ + auVar68._0_4_ + auVar65._0_4_;
        if ((int)uVar24 < (int)uVar7) {
          uVar18 = CONCAT44(0,~uVar24 + uVar7);
          auVar78 = vblendps_avx(ZEXT416((uint)fVar144),_DAT_00564cb0,0xe);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar18;
          auVar69 = vpshufd_avx(auVar66,0x44);
          auVar68 = vorps_avx(auVar69,auVar77);
          auVar70 = vorps_avx(auVar69,auVar77);
          uVar17 = 0;
          auVar164 = ZEXT1664(auVar78);
          do {
            auVar141 = auVar164;
            auVar83._8_8_ = 0;
            auVar83._0_8_ = uVar17;
            auVar78 = vpshufd_avx(auVar83,0x44);
            auVar102._16_16_ = auVar78;
            auVar102._0_16_ = auVar78;
            auVar166 = vorps_avx(auVar102,auVar4);
            auVar105 = vorps_avx(auVar102,auVar5);
            auVar78 = vorps_avx(auVar69,auVar77);
            auVar111._8_4_ = auVar105._24_4_;
            auVar111._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
            auVar111._12_4_ = auVar105._28_4_ ^ 0x80000000;
            auVar92 = vpcmpgtq_avx(auVar111,auVar78);
            auVar84._8_4_ = auVar105._8_4_;
            auVar168._8_4_ = auVar84._8_4_;
            auVar168._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
            auVar168._12_4_ = auVar105._12_4_ ^ 0x80000000;
            auVar91 = vpcmpgtq_avx(auVar168,auVar68);
            auVar91 = vpackssdw_avx(auVar91,auVar92);
            auVar177._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
            auVar177._8_4_ = auVar166._24_4_;
            auVar177._12_4_ = auVar166._28_4_ ^ 0x80000000;
            auVar93 = vpcmpgtq_avx(auVar177,auVar78);
            auVar178._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
            auVar178._8_4_ = auVar166._8_4_;
            auVar178._12_4_ = auVar166._12_4_ ^ 0x80000000;
            auVar78 = vpcmpgtq_avx(auVar178,auVar70);
            auVar78 = vpackssdw_avx(auVar78,auVar93);
            auVar78 = vpackssdw_avx(auVar78 ^ auVar80,auVar91 ^ auVar80);
            auVar91 = vpmovsxwd_avx(auVar78);
            auVar78 = vpunpckhwd_avx(auVar78,auVar78);
            auVar173._16_16_ = auVar78;
            auVar173._0_16_ = auVar91;
            auVar175 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])(*pauVar11 + uVar17 * 4));
            auVar133._0_4_ = auVar175._0_4_ + auVar141._0_4_;
            auVar133._4_4_ = auVar175._4_4_ + auVar141._4_4_;
            auVar133._8_4_ = auVar175._8_4_ + auVar141._8_4_;
            auVar133._12_4_ = auVar175._12_4_ + auVar141._12_4_;
            auVar136._16_4_ = auVar175._16_4_ + auVar141._16_4_;
            auVar136._0_16_ = auVar133;
            auVar136._20_4_ = auVar175._20_4_ + auVar141._20_4_;
            auVar136._24_4_ = auVar175._24_4_ + auVar141._24_4_;
            auVar136._28_4_ = auVar175._28_4_ + auVar141._28_4_;
            uVar17 = uVar17 + 8;
            auVar164 = ZEXT3264(auVar136);
          } while ((uVar18 + 8 & 0x1fffffff8) != uVar17);
          auVar78 = vorps_avx(auVar69,auVar77);
          auVar84._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
          auVar84._12_4_ = auVar105._12_4_ ^ 0x80000000;
          auVar78 = vpcmpgtq_avx(auVar84,auVar78);
          auVar68 = vpackssdw_avx(auVar78,auVar92);
          auVar78 = vorps_avx(auVar69,auVar77);
          auVar112._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
          auVar112._8_4_ = auVar166._8_4_;
          auVar112._12_4_ = auVar166._12_4_ ^ 0x80000000;
          auVar78 = vpcmpgtq_avx(auVar112,auVar78);
          auVar78 = vpackssdw_avx(auVar78,auVar93);
          auVar78 = vblendvps_avx(auVar141._0_16_,auVar133,auVar78 ^ auVar80);
          auVar68 = vblendvps_avx(auVar141._16_16_,auVar136._16_16_,auVar68 ^ auVar80);
          auVar78 = vhaddps_avx(auVar68,auVar78);
          auVar78 = vhaddps_avx(auVar78,auVar78);
          auVar78 = vhaddps_avx(auVar78,auVar78);
          fVar144 = auVar78._0_4_;
        }
        fVar144 = (1.0 / (float)(int)uVar7) * fVar144;
        auVar78 = vshufps_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),0);
        pauVar11 = pauVar10;
        if ((int)uVar7 < 8) {
          auVar166 = SUB6432(ZEXT864(0),0);
          uVar24 = 0;
        }
        else {
          auVar103._16_16_ = auVar78;
          auVar103._0_16_ = auVar78;
          auVar164 = ZEXT864(0);
          iVar13 = 7;
          do {
            auVar166 = vsubps_avx(*pauVar11,auVar103);
            auVar68 = vfmadd231ps_fma(auVar164._0_32_,auVar166,auVar166);
            auVar164 = ZEXT1664(auVar68);
            auVar166 = ZEXT1632(auVar68);
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar24 = uVar8;
          } while (iVar13 < (int)uVar7);
        }
        auVar68 = ZEXT816(0) << 0x40;
        uVar14 = uVar24 | 3;
        while ((int)uVar14 < (int)uVar7) {
          auVar70 = vsubps_avx(*(undefined1 (*) [16])*pauVar11,auVar78);
          auVar68 = vfmadd231ps_fma(auVar68,auVar70,auVar70);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar14 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar85._0_4_ = auVar166._0_4_ + auVar166._16_4_;
        auVar85._4_4_ = auVar166._4_4_ + auVar166._20_4_;
        auVar85._8_4_ = auVar166._8_4_ + auVar166._24_4_;
        auVar85._12_4_ = auVar166._12_4_ + auVar166._28_4_;
        auVar70 = vshufpd_avx(auVar85,auVar85,1);
        auVar86._0_4_ = auVar70._0_4_ + auVar85._0_4_;
        auVar86._4_4_ = auVar70._4_4_ + auVar85._4_4_;
        auVar86._8_4_ = auVar70._8_4_ + auVar85._8_4_;
        auVar86._12_4_ = auVar70._12_4_ + auVar85._12_4_;
        auVar70 = vshufpd_avx(auVar68,auVar68,1);
        auVar113._0_4_ = auVar68._0_4_ + auVar70._0_4_;
        auVar113._4_4_ = auVar68._4_4_ + auVar70._4_4_;
        auVar113._8_4_ = auVar68._8_4_ + auVar70._8_4_;
        auVar113._12_4_ = auVar68._12_4_ + auVar70._12_4_;
        auVar68 = vhaddps_avx(auVar86,auVar86);
        auVar70 = vmovshdup_avx(auVar113);
        fVar146 = auVar70._0_4_ + auVar68._0_4_ + auVar113._0_4_;
        auVar68 = ZEXT416((uint)fVar146);
        if ((int)uVar24 < (int)uVar7) {
          uVar17 = CONCAT44(0,~uVar24 + uVar7);
          auVar68 = vblendps_avx(ZEXT416((uint)fVar146),_DAT_00564cb0,0xe);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = uVar17;
          auVar69 = vpshufd_avx(auVar87,0x44);
          auVar165._16_16_ = auVar78;
          auVar165._0_16_ = auVar78;
          auVar78 = vorps_avx(auVar69,auVar77);
          auVar70 = vorps_avx(auVar69,auVar77);
          uVar18 = 0;
          do {
            auVar116 = auVar68;
            auVar88._8_8_ = 0;
            auVar88._0_8_ = uVar18;
            auVar68 = vpshufd_avx(auVar88,0x44);
            auVar104._16_16_ = auVar68;
            auVar104._0_16_ = auVar68;
            auVar166 = vorps_avx(auVar104,auVar4);
            auVar105 = vorps_avx(auVar104,auVar5);
            auVar68 = vorps_avx(auVar69,auVar77);
            auVar114._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
            auVar114._8_4_ = auVar105._24_4_;
            auVar114._12_4_ = auVar105._28_4_ ^ 0x80000000;
            auVar92 = vpcmpgtq_avx(auVar114,auVar68);
            auVar156._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
            auVar89._8_4_ = auVar105._8_4_;
            auVar156._8_4_ = auVar89._8_4_;
            auVar156._12_4_ = auVar105._12_4_ ^ 0x80000000;
            auVar91 = vpcmpgtq_avx(auVar156,auVar78);
            auVar91 = vpackssdw_avx(auVar91,auVar92);
            auVar30._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
            auVar30._8_4_ = auVar166._24_4_;
            auVar30._12_4_ = auVar166._28_4_ ^ 0x80000000;
            auVar93 = vpcmpgtq_avx(auVar30,auVar68);
            auVar31._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
            auVar31._8_4_ = auVar166._8_4_;
            auVar31._12_4_ = auVar166._12_4_ ^ 0x80000000;
            auVar68 = vpcmpgtq_avx(auVar31,auVar70);
            auVar68 = vpackssdw_avx(auVar68,auVar93);
            auVar68 = vpackssdw_avx(auVar68 ^ auVar80,auVar91 ^ auVar80);
            auVar91 = vpmovsxwd_avx(auVar68);
            auVar68 = vpunpckhwd_avx(auVar68,auVar68);
            auVar53._16_16_ = auVar68;
            auVar53._0_16_ = auVar91;
            auVar175 = vmaskmovps_avx(auVar53,*(undefined1 (*) [32])(*pauVar11 + uVar18 * 4));
            auVar175 = vsubps_avx(auVar175,auVar165);
            auVar68 = vfmadd213ps_fma(auVar175,auVar175,ZEXT1632(auVar116));
            uVar18 = uVar18 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar18);
          auVar78 = vorps_avx(auVar69,auVar77);
          auVar89._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
          auVar89._12_4_ = auVar105._12_4_ ^ 0x80000000;
          auVar78 = vpcmpgtq_avx(auVar89,auVar78);
          auVar70 = vpackssdw_avx(auVar78,auVar92);
          auVar78 = vorps_avx(auVar69,auVar77);
          auVar115._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
          auVar115._8_4_ = auVar166._8_4_;
          auVar115._12_4_ = auVar166._12_4_ ^ 0x80000000;
          auVar78 = vpcmpgtq_avx(auVar115,auVar78);
          auVar78 = vpackssdw_avx(auVar78,auVar93);
          auVar78 = vblendvps_avx(auVar116,auVar68,auVar78 ^ auVar80);
          auVar68 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar70 ^ auVar80);
          auVar78 = vhaddps_avx(auVar68,auVar78);
          auVar78 = vhaddps_avx(auVar78,auVar78);
          auVar68 = vhaddps_avx(auVar78,auVar78);
        }
        auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(1.0 / (float)(int)uVar7)),
                                  ZEXT416(*(uint *)(p_Var21 + 0xd8)));
        auVar78 = vrsqrtss_avx(auVar68,auVar68);
        auVar68 = vfmadd213ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar78._0_4_)),auVar78,
                                  ZEXT416(0xc0400000));
        auVar164 = ZEXT1664(auVar68);
        fVar146 = auVar78._0_4_ * -0.5 * auVar68._0_4_;
        fVar144 = fVar146 * -fVar144;
        auVar70 = ZEXT416((uint)fVar146);
        auVar78 = vshufps_avx(auVar70,auVar70,0);
        auVar174._16_16_ = auVar78;
        auVar174._0_16_ = auVar78;
        auVar68 = vshufps_avx(ZEXT416((uint)fVar144),ZEXT416((uint)fVar144),0);
        auVar185._16_16_ = auVar68;
        auVar185._0_16_ = auVar68;
        if (*(int *)(p_Var21 + 0xdc) == 0) {
          uVar24 = 0;
          if (7 < (int)uVar7) {
            iVar13 = 7;
            do {
              auVar70 = vfmadd132ps_fma(*pauVar10,auVar185,auVar174);
              *pauVar10 = ZEXT1632(auVar70);
              pauVar10 = pauVar10 + 1;
              iVar13 = iVar13 + 8;
              uVar24 = uVar8;
            } while (iVar13 < (int)uVar7);
          }
          uVar14 = uVar24 | 3;
          while ((int)uVar14 < (int)uVar7) {
            auVar70 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar10,auVar68,auVar78);
            *(undefined1 (*) [16])*pauVar10 = auVar70;
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
            uVar14 = uVar24 + 7;
            uVar24 = uVar24 + 4;
          }
          if ((int)uVar24 < (int)uVar7) {
            uVar17 = CONCAT44(0,~uVar24 + uVar7);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar17;
            auVar70 = vpshufd_avx(auVar32,0x44);
            auVar137._16_16_ = auVar78;
            auVar137._0_16_ = auVar78;
            auVar158._16_16_ = auVar68;
            auVar158._0_16_ = auVar68;
            auVar78 = vorps_avx(auVar70,auVar77);
            auVar68 = vorps_avx(auVar70,auVar77);
            uVar18 = 0;
            do {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar18;
              auVar69 = vpshufd_avx(auVar33,0x44);
              auVar54._16_16_ = auVar69;
              auVar54._0_16_ = auVar69;
              auVar166 = vorps_avx(auVar54,auVar4);
              auVar105 = vorps_avx(auVar54,auVar5);
              auVar69 = vorps_avx(auVar70,auVar77);
              auVar125._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
              auVar125._8_4_ = auVar105._24_4_;
              auVar125._12_4_ = auVar105._28_4_ ^ 0x80000000;
              auVar91 = vpcmpgtq_avx(auVar125,auVar69);
              auVar34._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
              auVar34._8_4_ = auVar105._8_4_;
              auVar34._12_4_ = auVar105._12_4_ ^ 0x80000000;
              auVar92 = vpcmpgtq_avx(auVar34,auVar78);
              auVar91 = vpackssdw_avx(auVar92,auVar91);
              auVar126._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
              auVar126._8_4_ = auVar166._24_4_;
              auVar126._12_4_ = auVar166._28_4_ ^ 0x80000000;
              auVar69 = vpcmpgtq_avx(auVar126,auVar69);
              auVar90._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
              auVar90._8_4_ = auVar166._8_4_;
              auVar90._12_4_ = auVar166._12_4_ ^ 0x80000000;
              auVar92 = vpcmpgtq_avx(auVar90,auVar68);
              auVar69 = vpackssdw_avx(auVar92,auVar69);
              auVar69 = vpackssdw_avx(auVar69 ^ auVar80,auVar91 ^ auVar80);
              auVar91 = vpmovsxwd_avx(auVar69);
              auVar69 = vpunpckhwd_avx(auVar69,auVar69);
              auVar55._16_16_ = auVar69;
              auVar55._0_16_ = auVar91;
              auVar166 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])(*pauVar10 + uVar18 * 4));
              auVar69 = vfmadd213ps_fma(auVar166,auVar137,auVar158);
              auVar166 = vmaskmovps_avx(auVar55,ZEXT1632(auVar69));
              *(undefined1 (*) [32])(*pauVar10 + uVar18 * 4) = auVar166;
              uVar18 = uVar18 + 8;
            } while ((uVar17 + 8 & 0x1fffffff8) != uVar18);
          }
        }
        else {
          pauVar11 = (undefined1 (*) [32])
                     (*(long *)(p_Var21 + 0xf0) * lVar28 + *(long *)(p_Var21 + 0xe0));
          pauVar29 = (undefined1 (*) [32])
                     (lVar28 * *(long *)(p_Var21 + 0x138) + *(long *)(p_Var21 + 0x128));
          fVar146 = auVar78._0_4_;
          fVar132 = auVar78._4_4_;
          fVar143 = auVar78._8_4_;
          uVar24 = 0;
          if (7 < (int)uVar7) {
            iVar13 = 7;
            do {
              auVar166 = *pauVar11;
              auVar141._0_4_ = fVar146 * auVar166._0_4_;
              auVar141._4_4_ = fVar132 * auVar166._4_4_;
              auVar141._8_4_ = fVar143 * auVar166._8_4_;
              auVar141._12_4_ = auVar78._12_4_ * auVar166._12_4_;
              auVar141._16_4_ = fVar146 * auVar166._16_4_;
              auVar141._20_4_ = fVar132 * auVar166._20_4_;
              auVar141._28_36_ = auVar164._28_36_;
              auVar141._24_4_ = fVar143 * auVar166._24_4_;
              auVar164 = ZEXT3264(auVar141._0_32_);
              auVar69 = vfmadd213ps_fma(auVar166,auVar185,*pauVar29);
              auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar141._0_32_,*pauVar10);
              *pauVar10 = ZEXT1632(auVar69);
              pauVar11 = pauVar11 + 1;
              pauVar29 = pauVar29 + 1;
              pauVar10 = pauVar10 + 1;
              iVar13 = iVar13 + 8;
              uVar24 = uVar8;
            } while (iVar13 < (int)uVar7);
          }
          uVar14 = uVar24 | 3;
          while ((int)uVar14 < (int)uVar7) {
            auVar69 = *(undefined1 (*) [16])*pauVar11;
            auVar67._0_4_ = fVar146 * auVar69._0_4_;
            auVar67._4_4_ = fVar132 * auVar69._4_4_;
            auVar67._8_4_ = fVar143 * auVar69._8_4_;
            auVar67._12_4_ = auVar78._12_4_ * auVar69._12_4_;
            auVar69 = vfmadd213ps_fma(auVar69,auVar68,*(undefined1 (*) [16])*pauVar29);
            auVar69 = vfmadd231ps_fma(auVar69,auVar67,*(undefined1 (*) [16])*pauVar10);
            *(undefined1 (*) [16])*pauVar10 = auVar69;
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
            uVar14 = uVar24 + 7;
            uVar24 = uVar24 + 4;
          }
          if ((int)uVar24 < (int)uVar7) {
            lVar28 = 0;
            do {
              auVar78 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar10 + lVar28 * 4)),
                                        ZEXT416((uint)fVar144),auVar70);
              auVar78 = vfmadd213ss_fma(auVar78,ZEXT416(*(uint *)(*pauVar11 + lVar28 * 4)),
                                        ZEXT416(*(uint *)(*pauVar29 + lVar28 * 4)));
              *(int *)(*pauVar10 + lVar28 * 4) = auVar78._0_4_;
              lVar28 = lVar28 + 1;
            } while (uVar7 - uVar24 != (int)lVar28);
          }
        }
        lVar25 = lVar25 + 1;
        p_Var21 = (_func_int *)((long)&this->_vptr_GroupNorm_x86_fma + (long)pp_Var2[-3]);
      } while (lVar25 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
  }
  else if ((iVar13 - 3U < 2) && (0 < iVar1)) {
    uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar8 = uVar24 & 0xfffffff8;
    fVar144 = 1.0 / (float)(int)(uVar24 * uVar7);
    lVar25 = 0;
    auVar164 = ZEXT1264(ZEXT812(0));
    auVar79._8_8_ = 0x8000000000000000;
    auVar79._0_8_ = 0x8000000000000000;
    auVar80 = vpcmpeqd_avx(auVar80,auVar80);
    do {
      lVar26 = lVar25 * (int)uVar7;
      uVar18 = bottom_top_blob->elemsize;
      lVar28 = bottom_top_blob->cstep * lVar26 * uVar18;
      pvVar3 = bottom_top_blob->data;
      uVar6 = ((long)bottom_top_blob->d * uVar18 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
              uVar18;
      pfVar9 = (float *)(*(long *)(p_Var21 + 0xf0) * lVar26 + *(long *)(p_Var21 + 0xe0));
      puVar27 = (uint *)(lVar26 * *(long *)(p_Var21 + 0x138) + *(long *)(p_Var21 + 0x128));
      if ((int)uVar7 < 1) {
        fVar146 = 0.0;
        auVar78 = ZEXT816(0) << 0x40;
      }
      else {
        lVar26 = uVar6 * uVar18;
        auVar141 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar12 = 0;
        do {
          pfVar22 = (float *)((long)pvVar3 + lVar26 * uVar12 + lVar28);
          if ((int)uVar24 < 8) {
            auVar160 = SUB6432(ZEXT864(0),0);
            uVar14 = 0;
          }
          else {
            auVar161 = ZEXT864(0);
            iVar13 = 7;
            do {
              auVar160._0_4_ = auVar161._0_4_ + *pfVar22;
              auVar160._4_4_ = auVar161._4_4_ + pfVar22[1];
              auVar160._8_4_ = auVar161._8_4_ + pfVar22[2];
              auVar160._12_4_ = auVar161._12_4_ + pfVar22[3];
              auVar160._16_4_ = auVar161._16_4_ + pfVar22[4];
              auVar160._20_4_ = auVar161._20_4_ + pfVar22[5];
              auVar160._24_4_ = auVar161._24_4_ + pfVar22[6];
              auVar160._28_4_ = auVar161._28_4_ + pfVar22[7];
              auVar161 = ZEXT3264(auVar160);
              pfVar22 = pfVar22 + 8;
              iVar13 = iVar13 + 8;
              uVar14 = uVar8;
            } while (iVar13 < (int)uVar24);
          }
          uVar16 = uVar14 | 3;
          auVar129 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar146 = auVar129._4_4_;
            fVar132 = auVar129._8_4_;
            fVar143 = auVar129._12_4_;
            if ((int)uVar24 <= (int)uVar16) break;
            auVar129._0_4_ = auVar129._0_4_ + *pfVar22;
            auVar129._4_4_ = fVar146 + pfVar22[1];
            auVar129._8_4_ = fVar132 + pfVar22[2];
            auVar129._12_4_ = fVar143 + pfVar22[3];
            pfVar22 = pfVar22 + 4;
            uVar16 = uVar14 + 7;
            uVar14 = uVar14 + 4;
          }
          auVar40._0_4_ = auVar160._0_4_ + auVar160._16_4_;
          auVar40._4_4_ = auVar160._4_4_ + auVar160._20_4_;
          auVar40._8_4_ = auVar160._8_4_ + auVar160._24_4_;
          auVar40._12_4_ = auVar160._12_4_ + auVar160._28_4_;
          auVar78 = vshufpd_avx(auVar40,auVar40,1);
          auVar41._0_4_ = auVar78._0_4_ + auVar40._0_4_;
          auVar41._4_4_ = auVar78._4_4_ + auVar40._4_4_;
          auVar41._8_4_ = auVar78._8_4_ + auVar40._8_4_;
          auVar41._12_4_ = auVar78._12_4_ + auVar40._12_4_;
          auVar78 = vmovshdup_avx(auVar41);
          auVar68 = vshufpd_avx(auVar129,auVar129,1);
          auVar121._0_4_ = auVar129._0_4_ + auVar68._0_4_;
          auVar121._4_4_ = fVar146 + auVar68._4_4_;
          auVar121._8_4_ = fVar132 + auVar68._8_4_;
          auVar121._12_4_ = fVar143 + auVar68._12_4_;
          auVar68 = vmovshdup_avx(auVar121);
          fVar146 = auVar68._0_4_ + auVar141._0_4_ + auVar78._0_4_ + auVar41._0_4_ + auVar121._0_4_;
          auVar141 = ZEXT464((uint)fVar146);
          if ((int)uVar14 < (int)uVar24) {
            uVar20 = CONCAT44(0,~uVar14 + uVar24);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar20;
            auVar70 = vpshufd_avx(auVar42,0x44);
            auVar78 = vorps_avx(auVar70,auVar79);
            auVar68 = vorps_avx(auVar70,auVar79);
            uVar19 = 0;
            auVar141 = ZEXT1664(CONCAT124(auVar164._4_12_,fVar146));
            do {
              auVar161 = auVar141;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = uVar19;
              auVar69 = vpshufd_avx(auVar43,0x44);
              auVar59._16_16_ = auVar69;
              auVar59._0_16_ = auVar69;
              auVar166 = vorps_avx(auVar59,auVar4);
              auVar105 = vorps_avx(auVar59,auVar5);
              auVar69 = vorps_avx(auVar70,auVar79);
              auVar44._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
              auVar44._8_4_ = auVar105._24_4_;
              auVar44._12_4_ = auVar105._28_4_ ^ 0x80000000;
              auVar92 = vpcmpgtq_avx(auVar44,auVar69);
              auVar170._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
              auVar101._8_4_ = auVar105._8_4_;
              auVar170._8_4_ = auVar101._8_4_;
              auVar170._12_4_ = auVar105._12_4_ ^ 0x80000000;
              auVar91 = vpcmpgtq_avx(auVar170,auVar78);
              auVar91 = vpackssdw_avx(auVar91,auVar92);
              auVar181._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
              auVar181._8_4_ = auVar166._24_4_;
              auVar181._12_4_ = auVar166._28_4_ ^ 0x80000000;
              auVar93 = vpcmpgtq_avx(auVar181,auVar69);
              auVar182._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
              auVar182._8_4_ = auVar166._8_4_;
              auVar182._12_4_ = auVar166._12_4_ ^ 0x80000000;
              auVar69 = vpcmpgtq_avx(auVar182,auVar68);
              auVar69 = vpackssdw_avx(auVar69,auVar93);
              auVar69 = vpackssdw_avx(auVar69 ^ auVar80,auVar91 ^ auVar80);
              auVar91 = vpmovsxwd_avx(auVar69);
              auVar69 = vpunpckhwd_avx(auVar69,auVar69);
              auVar176._16_16_ = auVar69;
              auVar176._0_16_ = auVar91;
              auVar175 = vmaskmovps_avx(auVar176,*(undefined1 (*) [32])(pfVar22 + uVar19));
              auVar135._0_4_ = auVar175._0_4_ + auVar161._0_4_;
              auVar135._4_4_ = auVar175._4_4_ + auVar161._4_4_;
              auVar135._8_4_ = auVar175._8_4_ + auVar161._8_4_;
              auVar135._12_4_ = auVar175._12_4_ + auVar161._12_4_;
              auVar140._16_4_ = auVar175._16_4_ + auVar161._16_4_;
              auVar140._0_16_ = auVar135;
              auVar140._20_4_ = auVar175._20_4_ + auVar161._20_4_;
              auVar140._24_4_ = auVar175._24_4_ + auVar161._24_4_;
              auVar140._28_4_ = auVar175._28_4_ + auVar161._28_4_;
              uVar19 = uVar19 + 8;
              auVar141 = ZEXT3264(auVar140);
            } while ((uVar20 + 8 & 0x1fffffff8) != uVar19);
            auVar78 = vorps_avx(auVar70,auVar79);
            auVar101._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
            auVar101._12_4_ = auVar105._12_4_ ^ 0x80000000;
            auVar78 = vpcmpgtq_avx(auVar101,auVar78);
            auVar68 = vpackssdw_avx(auVar78,auVar92);
            auVar78 = vorps_avx(auVar70,auVar79);
            auVar130._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
            auVar130._8_4_ = auVar166._8_4_;
            auVar130._12_4_ = auVar166._12_4_ ^ 0x80000000;
            auVar78 = vpcmpgtq_avx(auVar130,auVar78);
            auVar78 = vpackssdw_avx(auVar78,auVar93);
            auVar78 = vblendvps_avx(auVar161._0_16_,auVar135,auVar78 ^ auVar80);
            auVar68 = vblendvps_avx(auVar161._16_16_,auVar140._16_16_,auVar68 ^ auVar80);
            auVar78 = vhaddps_avx(auVar68,auVar78);
            auVar78 = vhaddps_avx(auVar78,auVar78);
            auVar78 = vhaddps_avx(auVar78,auVar78);
            auVar141 = ZEXT1664(auVar78);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar17);
        fVar146 = auVar141._0_4_ * fVar144;
        if ((int)uVar7 < 1) {
          auVar78 = ZEXT816(0);
        }
        else {
          auVar68 = vshufps_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),0);
          auVar162._16_16_ = auVar68;
          auVar162._0_16_ = auVar68;
          auVar141 = ZEXT864(0);
          uVar12 = 0;
          do {
            pauVar10 = (undefined1 (*) [32])((long)pvVar3 + lVar26 * uVar12 + lVar28);
            if ((int)uVar24 < 8) {
              auVar166 = SUB6432(ZEXT864(0),0);
              uVar14 = 0;
            }
            else {
              auVar161 = ZEXT864(0);
              iVar13 = 7;
              do {
                auVar166 = vsubps_avx(*pauVar10,auVar162);
                auVar78 = vfmadd231ps_fma(auVar161._0_32_,auVar166,auVar166);
                auVar161 = ZEXT1664(auVar78);
                auVar166 = ZEXT1632(auVar78);
                pauVar10 = pauVar10 + 1;
                iVar13 = iVar13 + 8;
                uVar14 = uVar8;
              } while (iVar13 < (int)uVar24);
            }
            auVar78 = ZEXT816(0) << 0x40;
            uVar16 = uVar14 | 3;
            while ((int)uVar16 < (int)uVar24) {
              auVar70 = vsubps_avx(*(undefined1 (*) [16])*pauVar10,auVar68);
              auVar78 = vfmadd231ps_fma(auVar78,auVar70,auVar70);
              pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
              uVar16 = uVar14 + 7;
              uVar14 = uVar14 + 4;
            }
            auVar45._0_4_ = auVar166._0_4_ + auVar166._16_4_;
            auVar45._4_4_ = auVar166._4_4_ + auVar166._20_4_;
            auVar45._8_4_ = auVar166._8_4_ + auVar166._24_4_;
            auVar45._12_4_ = auVar166._12_4_ + auVar166._28_4_;
            auVar70 = vshufpd_avx(auVar45,auVar45,1);
            auVar46._0_4_ = auVar70._0_4_ + auVar45._0_4_;
            auVar46._4_4_ = auVar70._4_4_ + auVar45._4_4_;
            auVar46._8_4_ = auVar70._8_4_ + auVar45._8_4_;
            auVar46._12_4_ = auVar70._12_4_ + auVar45._12_4_;
            auVar70 = vmovshdup_avx(auVar46);
            auVar69 = vshufpd_avx(auVar78,auVar78,1);
            auVar122._0_4_ = auVar78._0_4_ + auVar69._0_4_;
            auVar122._4_4_ = auVar78._4_4_ + auVar69._4_4_;
            auVar122._8_4_ = auVar78._8_4_ + auVar69._8_4_;
            auVar122._12_4_ = auVar78._12_4_ + auVar69._12_4_;
            auVar78 = vmovshdup_avx(auVar122);
            fVar132 = auVar78._0_4_ +
                      auVar141._0_4_ + auVar70._0_4_ + auVar46._0_4_ + auVar122._0_4_;
            auVar141 = ZEXT464((uint)fVar132);
            if ((int)uVar14 < (int)uVar24) {
              uVar20 = CONCAT44(0,~uVar14 + uVar24);
              auVar171._4_12_ = auVar164._4_12_;
              auVar171._0_4_ = fVar132;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = uVar20;
              auVar69 = vpshufd_avx(auVar47,0x44);
              auVar78 = vorps_avx(auVar69,auVar79);
              auVar70 = vorps_avx(auVar69,auVar79);
              uVar19 = 0;
              do {
                auVar94 = auVar171;
                auVar48._8_8_ = 0;
                auVar48._0_8_ = uVar19;
                auVar91 = vpshufd_avx(auVar48,0x44);
                auVar60._16_16_ = auVar91;
                auVar60._0_16_ = auVar91;
                auVar166 = vorps_avx(auVar60,auVar4);
                auVar105 = vorps_avx(auVar60,auVar5);
                auVar91 = vorps_avx(auVar69,auVar79);
                auVar49._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
                auVar49._8_4_ = auVar105._24_4_;
                auVar49._12_4_ = auVar105._28_4_ ^ 0x80000000;
                auVar93 = vpcmpgtq_avx(auVar49,auVar91);
                auVar172._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
                auVar123._8_4_ = auVar105._8_4_;
                auVar172._8_4_ = auVar123._8_4_;
                auVar172._12_4_ = auVar105._12_4_ ^ 0x80000000;
                auVar92 = vpcmpgtq_avx(auVar172,auVar78);
                auVar92 = vpackssdw_avx(auVar92,auVar93);
                auVar71._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
                auVar71._8_4_ = auVar166._24_4_;
                auVar71._12_4_ = auVar166._28_4_ ^ 0x80000000;
                auVar116 = vpcmpgtq_avx(auVar71,auVar91);
                auVar72._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
                auVar72._8_4_ = auVar166._8_4_;
                auVar72._12_4_ = auVar166._12_4_ ^ 0x80000000;
                auVar91 = vpcmpgtq_avx(auVar72,auVar70);
                auVar91 = vpackssdw_avx(auVar91,auVar116);
                auVar91 = vpackssdw_avx(auVar91 ^ auVar80,auVar92 ^ auVar80);
                auVar92 = vpmovsxwd_avx(auVar91);
                auVar91 = vpunpckhwd_avx(auVar91,auVar91);
                auVar76._16_16_ = auVar91;
                auVar76._0_16_ = auVar92;
                auVar175 = vmaskmovps_avx(auVar76,*(undefined1 (*) [32])(*pauVar10 + uVar19 * 4));
                auVar175 = vsubps_avx(auVar175,auVar162);
                auVar171 = vfmadd213ps_fma(auVar175,auVar175,ZEXT1632(auVar94));
                uVar19 = uVar19 + 8;
              } while ((uVar20 + 8 & 0x1fffffff8) != uVar19);
              auVar78 = vorps_avx(auVar69,auVar79);
              auVar123._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
              auVar123._12_4_ = auVar105._12_4_ ^ 0x80000000;
              auVar78 = vpcmpgtq_avx(auVar123,auVar78);
              auVar70 = vpackssdw_avx(auVar78,auVar93);
              auVar78 = vorps_avx(auVar69,auVar79);
              auVar124._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
              auVar124._8_4_ = auVar166._8_4_;
              auVar124._12_4_ = auVar166._12_4_ ^ 0x80000000;
              auVar78 = vpcmpgtq_avx(auVar124,auVar78);
              auVar78 = vpackssdw_avx(auVar78,auVar116);
              auVar78 = vblendvps_avx(auVar94,auVar171,auVar78 ^ auVar80);
              auVar70 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar70 ^ auVar80)
              ;
              auVar78 = vhaddps_avx(auVar70,auVar78);
              auVar78 = vhaddps_avx(auVar78,auVar78);
              auVar78 = vhaddps_avx(auVar78,auVar78);
              auVar141 = ZEXT1664(auVar78);
              auVar164 = ZEXT864(0);
            }
            auVar78 = auVar141._0_16_;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar17);
        }
      }
      auVar68 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar144),
                                ZEXT416(*(uint *)(&this->field_0xd8 + (long)local_80)));
      auVar78 = vrsqrtss_avx(auVar68,auVar68);
      auVar68 = vfmadd213ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar78._0_4_)),auVar78,
                                ZEXT416(0xc0400000));
      if (0 < (int)uVar7) {
        fVar132 = auVar78._0_4_ * -0.5 * auVar68._0_4_;
        uVar12 = 0;
        do {
          auVar78 = ZEXT416((uint)(fVar132 * -fVar146));
          fVar143 = fVar132;
          if (*(int *)(&this->field_0xdc + (long)pp_Var2[-3]) != 0) {
            fVar143 = fVar132 * *pfVar9;
            auVar78 = vfmadd213ss_fma(ZEXT416((uint)*pfVar9),auVar78,ZEXT416(*puVar27));
          }
          pauVar10 = (undefined1 (*) [32])((long)pvVar3 + uVar6 * uVar18 * uVar12 + lVar28);
          auVar68 = vshufps_avx(ZEXT416((uint)fVar143),ZEXT416((uint)fVar143),0);
          auVar78 = vshufps_avx(auVar78,auVar78,0);
          uVar14 = 0;
          if (7 < (int)uVar24) {
            auVar61._16_16_ = auVar68;
            auVar61._0_16_ = auVar68;
            auVar110._16_16_ = auVar78;
            auVar110._0_16_ = auVar78;
            iVar13 = 7;
            do {
              auVar70 = vfmadd132ps_fma(*pauVar10,auVar110,auVar61);
              *pauVar10 = ZEXT1632(auVar70);
              pauVar10 = pauVar10 + 1;
              iVar13 = iVar13 + 8;
              uVar14 = uVar8;
            } while (iVar13 < (int)uVar24);
          }
          uVar16 = uVar14 | 3;
          while ((int)uVar16 < (int)uVar24) {
            auVar70 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar10,auVar78,auVar68);
            *(undefined1 (*) [16])*pauVar10 = auVar70;
            pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
            uVar16 = uVar14 + 7;
            uVar14 = uVar14 + 4;
          }
          if ((int)uVar14 < (int)uVar24) {
            uVar19 = CONCAT44(0,~uVar14 + uVar24);
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar19;
            auVar70 = vpshufd_avx(auVar50,0x44);
            auVar167._16_16_ = auVar68;
            auVar167._0_16_ = auVar68;
            auVar163._16_16_ = auVar78;
            auVar163._0_16_ = auVar78;
            auVar78 = vorps_avx(auVar70,auVar79);
            auVar68 = vorps_avx(auVar70,auVar79);
            uVar20 = 0;
            do {
              auVar51._8_8_ = 0;
              auVar51._0_8_ = uVar20;
              auVar69 = vpshufd_avx(auVar51,0x44);
              auVar62._16_16_ = auVar69;
              auVar62._0_16_ = auVar69;
              auVar166 = vorps_avx(auVar62,auVar4);
              auVar105 = vorps_avx(auVar62,auVar5);
              auVar69 = vorps_avx(auVar70,auVar79);
              auVar183._0_8_ = auVar105._16_8_ ^ 0x8000000000000000;
              auVar183._8_4_ = auVar105._24_4_;
              auVar183._12_4_ = auVar105._28_4_ ^ 0x80000000;
              auVar91 = vpcmpgtq_avx(auVar183,auVar69);
              auVar52._0_8_ = auVar105._0_8_ ^ 0x8000000000000000;
              auVar52._8_4_ = auVar105._8_4_;
              auVar52._12_4_ = auVar105._12_4_ ^ 0x80000000;
              auVar92 = vpcmpgtq_avx(auVar52,auVar78);
              auVar91 = vpackssdw_avx(auVar92,auVar91);
              auVar184._0_8_ = auVar166._16_8_ ^ 0x8000000000000000;
              auVar184._8_4_ = auVar166._24_4_;
              auVar184._12_4_ = auVar166._28_4_ ^ 0x80000000;
              auVar69 = vpcmpgtq_avx(auVar184,auVar69);
              auVar73._0_8_ = auVar166._0_8_ ^ 0x8000000000000000;
              auVar73._8_4_ = auVar166._8_4_;
              auVar73._12_4_ = auVar166._12_4_ ^ 0x80000000;
              auVar92 = vpcmpgtq_avx(auVar73,auVar68);
              auVar69 = vpackssdw_avx(auVar92,auVar69);
              auVar69 = vpackssdw_avx(auVar69 ^ auVar80,auVar91 ^ auVar80);
              auVar91 = vpmovsxwd_avx(auVar69);
              auVar69 = vpunpckhwd_avx(auVar69,auVar69);
              auVar63._16_16_ = auVar69;
              auVar63._0_16_ = auVar91;
              auVar166 = vmaskmovps_avx(auVar63,*(undefined1 (*) [32])(*pauVar10 + uVar20 * 4));
              auVar69 = vfmadd213ps_fma(auVar166,auVar167,auVar163);
              auVar166 = vmaskmovps_avx(auVar63,ZEXT1632(auVar69));
              *(undefined1 (*) [32])(*pauVar10 + uVar20 * 4) = auVar166;
              uVar20 = uVar20 + 8;
            } while ((uVar19 + 8 & 0x1fffffff8) != uVar20);
          }
          pfVar9 = pfVar9 + 1;
          puVar27 = puVar27 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar17);
        local_80 = pp_Var2[-3];
      }
      lVar25 = lVar25 + 1;
      p_Var21 = (_func_int *)((long)&this->_vptr_GroupNorm_x86_fma + (long)local_80);
    } while (lVar25 < *(int *)(&this->field_0xd0 + (long)local_80));
  }
  return 0;
}

Assistant:

int GroupNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}